

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.h
# Opt level: O0

const_iterator __thiscall
frozen::
set<std::basic_string_view<char,std::char_traits<char>>,5ul,std::less<std::basic_string_view<char,std::char_traits<char>>>>
::find<std::basic_string_view<char,std::char_traits<char>>>
          (set<std::basic_string_view<char,_std::char_traits<char>_>,_5UL,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           *this,basic_string_view<char,_std::char_traits<char>_> *key)

{
  bool bVar1;
  const_iterator pvVar2;
  const_iterator pvVar3;
  const_iterator pvVar4;
  set<std::basic_string_view<char,_std::char_traits<char>_>,_5UL,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *in_RSI;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  less<std::basic_string_view<char,_std::char_traits<char>_>_> *unaff_retaddr;
  const_iterator where;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffe0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffff8;
  
  pvVar2 = lower_bound<std::basic_string_view<char,std::char_traits<char>>>
                     (in_RSI,in_stack_ffffffffffffffe0);
  pvVar4 = pvVar2;
  pvVar3 = set<std::basic_string_view<char,_std::char_traits<char>_>,_5UL,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ::end((set<std::basic_string_view<char,_std::char_traits<char>_>,_5UL,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)0x59809b);
  if ((pvVar2 == pvVar3) ||
     (bVar1 = std::less<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                        (unaff_retaddr,in_stack_fffffffffffffff8,in_RDI), bVar1)) {
    pvVar4 = set<std::basic_string_view<char,_std::char_traits<char>_>,_5UL,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ::end((set<std::basic_string_view<char,_std::char_traits<char>_>,_5UL,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    *)0x5980d6);
  }
  return pvVar4;
}

Assistant:

constexpr const_iterator find(KeyType const &key) const {
    const_iterator where = lower_bound(key);
    if ((where != end()) && !less_than_(key, *where))
      return where;
    else
      return end();
  }